

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v7::detail::
arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>::
write_int<__int128>(arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                    *this,__int128 value,format_specs *spec)

{
  byte bVar1;
  long in_RCX;
  long in_RDX;
  undefined1 local_58 [40];
  long local_30;
  char local_28;
  uint local_24;
  
  local_58._0_8_ = (this->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
  ;
  local_58._8_8_ = (this->locale_).locale_;
  local_24 = 0;
  if (in_RDX < 0) {
    local_58._32_8_ = -(long)spec;
    local_28 = '-';
    local_24 = 1;
    local_30 = -(ulong)(spec != (format_specs *)0x0) - in_RDX;
  }
  else {
    bVar1 = *(byte *)(in_RCX + 9) >> 4 & 7;
    local_58._32_8_ = spec;
    local_30 = in_RDX;
    if (1 < bVar1) {
      local_28 = ' ';
      if (bVar1 == 2) {
        local_28 = '+';
      }
      local_24 = 1;
    }
  }
  handle_int_type_spec<fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,char,unsigned__int128>&>
            (*(char *)(in_RCX + 8),
             (int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128> *)local_58
            );
  (this->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
       (buffer<char> *)local_58._0_8_;
  return;
}

Assistant:

void write_int(T value, const format_specs& spec) {
    using uint_type = uint32_or_64_or_128_t<T>;
    int_writer<iterator, Char, uint_type> w(out_, locale_, value, spec);
    handle_int_type_spec(spec.type, w);
    out_ = w.out;
  }